

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_wbl.c
# Opt level: O3

void beltWBLStepDBase(void *buf,size_t count,void *state)

{
  long *src;
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  belt_wbl_st *st;
  ulong uVar4;
  
  uVar2 = count + 0xf >> 3 & 0x1ffffffffffffffe;
  *(ulong *)((long)state + 0x40) = uVar2;
  if (uVar2 != 0) {
    src = (long *)((long)state + 0x40);
    do {
      *(undefined8 *)((long)state + 0x20) = *(undefined8 *)((long)buf + (count - 0x10));
      *(undefined8 *)((long)state + 0x28) = *(undefined8 *)((long)buf + (count - 8));
      memMove((void *)((long)buf + 0x10),buf,count - 0x10);
      *(undefined8 *)buf = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)((long)buf + 8) = *(undefined8 *)((long)state + 0x28);
      beltBlockEncr((octet *)((long)state + 0x20),(u32 *)state);
      memXor2((octet *)((long)state + 0x20),src,8);
      puVar1 = (ulong *)((long)buf + (count - 0x10));
      *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x20);
      puVar1 = (ulong *)((long)buf + (count - 8));
      *puVar1 = *puVar1 ^ *(ulong *)((long)state + 0x28);
      if (0x20 < count) {
        uVar2 = *buf;
        uVar3 = *(ulong *)((long)buf + 8);
        uVar4 = 0x20;
        do {
          uVar2 = uVar2 ^ *(ulong *)((long)buf + (uVar4 - 0x10));
          *(ulong *)buf = uVar2;
          uVar3 = uVar3 ^ *(ulong *)((long)buf + (uVar4 - 8));
          *(ulong *)((long)buf + 8) = uVar3;
          uVar4 = uVar4 + 0x10;
        } while (uVar4 < count);
      }
      *src = *src + -1;
    } while (*src != 0);
  }
  return;
}

Assistant:

void beltWBLStepDBase(void* buf, size_t count, void* state)
{
	belt_wbl_st* st = (belt_wbl_st*)state;
	word n = ((word)count + 15) / 16;
	ASSERT(count >= 32);
	ASSERT(memIsDisjoint2(buf, count, state, beltWBL_keep()));
	for (st->round = 2 * n; st->round; --st->round)
	{
		size_t i;
		// block <- r*
		beltBlockCopy(st->block, (octet*)buf + count - 16);
		// r <- ShHi^128(r)
		memMove((octet*)buf + 16, buf, count - 16);
		// r1 <- block
		beltBlockCopy(buf, st->block);
		// block <- beltBlockEncr(block) + <round>
		beltBlockEncr(st->block, st->key);
#if (OCTET_ORDER == LITTLE_ENDIAN)
		memXor2(st->block, &st->round, O_PER_W);
#else // BIG_ENDIAN
		st->round = wordRev(st->round);
		memXor2(st->block, &st->round, O_PER_W);
		st->round = wordRev(st->round);
#endif // OCTET_ORDER
		// r* <- r* + block
		beltBlockXor2((octet*)buf + count - 16, st->block);
		// r1 <- r1 + r2 + ... + r_{n-1}
		for (i = 16; i + 16 < count; i += 16)
			beltBlockXor2(buf, (octet*)buf + i);
	}
}